

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswread.c
# Opt level: O0

int ssw_loadrecord(ssw_fileinternal_t *f)

{
  int iVar1;
  void *pvVar2;
  FILE *__stream;
  int *in_RDI;
  uint64_t rl_3;
  uint32_t rl_2;
  char *buf;
  uint64_t rl_1;
  uint32_t rl;
  char *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  uint in_stack_ffffffffffffffd4;
  undefined8 local_20;
  uint local_14;
  uint local_4;
  
  if (*in_RDI == 4) {
    iVar1 = ssw_try_readbytes((ssw_fileinternal_t *)
                              CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                              in_stack_ffffffffffffffc8,0);
    if (iVar1 == 0) {
      return 0;
    }
    *(ulong *)(in_RDI + 0x5c) = (ulong)local_14;
  }
  else {
    iVar1 = ssw_try_readbytes((ssw_fileinternal_t *)
                              CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                              in_stack_ffffffffffffffc8,0);
    if (iVar1 == 0) {
      return 0;
    }
    *(undefined8 *)(in_RDI + 0x5c) = local_20;
  }
  if (*(ulong *)(in_RDI + 0x5e) < *(ulong *)(in_RDI + 0x5c)) {
    if (0x3fffffff < *(ulong *)(in_RDI + 0x5c)) {
      ssw_error((char *)0x102630);
    }
    free(*(void **)(in_RDI + 0x60));
    *(undefined8 *)(in_RDI + 0x5e) = *(undefined8 *)(in_RDI + 0x5c);
    pvVar2 = malloc(*(size_t *)(in_RDI + 0x5e));
    *(void **)(in_RDI + 0x60) = pvVar2;
    if (*(long *)(in_RDI + 0x60) == 0) {
      ssw_error((char *)0x102694);
    }
  }
  if ((*(ulong *)(in_RDI + 0x5c) < 0x401) && (0x400 < *(ulong *)(in_RDI + 0x5e))) {
    free(*(void **)(in_RDI + 0x60));
    in_RDI[0x5e] = 0x400;
    in_RDI[0x5f] = 0;
    pvVar2 = malloc(*(size_t *)(in_RDI + 0x5e));
    *(void **)(in_RDI + 0x60) = pvVar2;
    if (*(long *)(in_RDI + 0x60) == 0) {
      ssw_error((char *)0x102716);
    }
  }
  if (*(long *)(in_RDI + 0x60) == 0) {
    __stream = (FILE *)ssw_stdout();
    fprintf(__stream,"SSW Error: unable to allocate requested buffer (corrupted input?).\n");
    local_4 = 0;
  }
  else {
    ssw_readbytes((ssw_fileinternal_t *)
                  CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                  in_stack_ffffffffffffffc8,0x102776);
    if (*in_RDI == 4) {
      ssw_readbytes((ssw_fileinternal_t *)
                    CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                    in_stack_ffffffffffffffc8,0x102794);
      local_4 = (uint)(*(ulong *)(in_RDI + 0x5c) == (ulong)in_stack_ffffffffffffffd4);
    }
    else {
      ssw_readbytes((ssw_fileinternal_t *)
                    CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                    in_stack_ffffffffffffffc8,0x1027c7);
      local_4 = (uint)(*(char **)(in_RDI + 0x5c) == in_stack_ffffffffffffffc8);
    }
  }
  return local_4;
}

Assistant:

int ssw_loadrecord(ssw_fileinternal_t* f)
{
  if (f->reclen==4) {
    uint32_t rl;
    if (!ssw_try_readbytes(f, (char*)&rl, 4))
      return 0;
    f->lbuf = rl;
  } else {
    uint64_t rl;
    if (!ssw_try_readbytes(f, (char*)&rl, 8))
      return 0;
    f->lbuf = rl;
  }

  if (f->lbuf > f->lbufmax) {
    //Very large record, must grow buffer. But first check it fits in 32 integer
    //limit (so we can cast below):
    if (f->lbuf > INT_MAX / 2 )
      ssw_error("too large record encountered");
    free(f->buf);
    f->lbufmax = f->lbuf;
    f->buf = malloc(f->lbufmax);
    if (!f->buf)
      ssw_error("memory allocation failure");
  }

  if ( f->lbuf <= SSWREAD_STDBUFSIZE
       && f->lbufmax > SSWREAD_STDBUFSIZE ) {
    //Make sure we don't hold on to very large buffers once they are no longer
    //needed:
    free(f->buf);
    f->lbufmax = SSWREAD_STDBUFSIZE;
    f->buf = malloc(f->lbufmax);
    if (!f->buf)
      ssw_error("memory allocation failure");
  }

  if (!f->buf) {
    //Could be corrupted data resulting in unusually large lbuf:
    fprintf(ssw_stdout(),
            "SSW Error: unable to allocate"
            " requested buffer (corrupted input?).\n");
    return 0;
  }

  char * buf = (char*)f->buf;
  ssw_readbytes(f, buf, f->lbuf );
  if (f->reclen==4) {
    uint32_t rl;
    ssw_readbytes(f, (char*)&rl, 4);
    return ( f->lbuf == rl );
  } else {
    uint64_t rl;
    ssw_readbytes(f, (char*)&rl, 8);
    return ( f->lbuf == rl );
  }
}